

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O2

void Gia_ObjAddFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  size_t __size;
  char *__assertion;
  uint *puVar8;
  uint *puVar9;
  
  if (p->pFanData == (int *)0x0) {
    __assertion = "p->pFanData";
    uVar1 = 0x77;
LAB_00597d05:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,uVar1,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assertion = "!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)";
    uVar1 = 0x78;
    goto LAB_00597d05;
  }
  iVar4 = Gia_ObjId(p,pFanout);
  if (iVar4 < 1) {
    __assertion = "Gia_ObjId(p, pFanout) > 0";
    uVar1 = 0x79;
    goto LAB_00597d05;
  }
  iVar4 = Gia_ObjId(p,pObj);
  if (iVar4 < p->nFansAlloc) {
    iVar4 = Gia_ObjId(p,pFanout);
    if (iVar4 < p->nFansAlloc) goto LAB_00597b8f;
  }
  iVar5 = Gia_ObjId(p,pObj);
  iVar4 = Gia_ObjId(p,pFanout);
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  __size = (long)(iVar4 * 10) << 2;
  if (p->pFanData == (int *)0x0) {
    piVar7 = (int *)malloc(__size);
  }
  else {
    piVar7 = (int *)realloc(p->pFanData,__size);
  }
  p->pFanData = piVar7;
  memset(piVar7 + (long)p->nFansAlloc * 5,0,((long)iVar4 * 2 - (long)p->nFansAlloc) * 0x14);
  p->nFansAlloc = (int)((long)iVar4 * 2);
LAB_00597b8f:
  iVar4 = Gia_ObjId(p,pObj);
  if (iVar4 < p->nFansAlloc) {
    iVar4 = Gia_ObjId(p,pFanout);
    if (iVar4 < p->nFansAlloc) {
      iVar4 = Gia_ObjId(p,pFanout);
      iVar5 = Gia_ObjWhatFanin(p,pFanout,pObj);
      uVar6 = Gia_FanoutCreate(iVar4,iVar5);
      piVar7 = p->pFanData;
      puVar9 = (uint *)(piVar7 + (long)(((int)uVar6 >> 1) * 5) + (ulong)(uVar6 & 1) + 1);
      puVar8 = (uint *)(piVar7 + (long)(((int)uVar6 >> 1) * 5) + (ulong)(uVar6 & 1) + 3);
      iVar4 = Gia_ObjId(p,pObj);
      iVar4 = iVar4 * 5;
      uVar1 = piVar7[iVar4];
      if (uVar1 == 0) {
        piVar7[iVar4] = uVar6;
      }
      else {
        piVar3 = p->pFanData;
        uVar2 = piVar3[(long)(((int)uVar1 >> 1) * 5) + (ulong)(uVar1 & 1) + 1];
        if (piVar3[(long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3] != uVar1) {
          __assert_fail("*pNext == *pFirst",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                        ,0x90,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        *puVar9 = uVar2;
        puVar9 = (uint *)(piVar3 + (long)(((int)uVar1 >> 1) * 5) + (ulong)(uVar1 & 1) + 1);
        *puVar8 = piVar7[iVar4];
        puVar8 = (uint *)(piVar3 + (long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3);
      }
      *puVar9 = uVar6;
      *puVar8 = uVar6;
      return;
    }
  }
  __assert_fail("Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                ,0x81,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjAddFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    if ( Gia_ObjId(p, pObj) >= p->nFansAlloc || Gia_ObjId(p, pFanout) >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( Gia_ObjId(p, pObj), Gia_ObjId(p, pFanout) ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Gia_FanoutPrev( p->pFanData, *pFirst );
        pNext = Gia_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}